

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O0

void duckdb::IntegralDecompressFunction<unsigned_char,duckdb::hugeint_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  hugeint_t *phVar1;
  reference result_00;
  Vector *in_RDX;
  DataChunk *in_RDI;
  hugeint_t min_val;
  idx_t in_stack_ffffffffffffffb8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffc0;
  uint64_t local_28;
  int64_t local_20;
  Vector *local_18;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  vector<duckdb::Vector,_true>::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  phVar1 = ConstantVector::GetData<duckdb::hugeint_t>((Vector *)0x11cfcba);
  local_28 = phVar1->lower;
  local_20 = phVar1->upper;
  result_00 = vector<duckdb::Vector,_true>::operator[]
                        (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  DataChunk::size(local_8);
  UnaryExecutor::
  Execute<unsigned_char,duckdb::hugeint_t,duckdb::IntegralDecompressFunction<unsigned_char,duckdb::hugeint_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_char_const&)_1_>
            (local_18,result_00,in_stack_ffffffffffffffb8,(hugeint_t *)&local_28,CANNOT_ERROR);
  return;
}

Assistant:

static void IntegralDecompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	D_ASSERT(args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR);
	D_ASSERT(args.data[1].GetType() == result.GetType());
	const auto min_val = ConstantVector::GetData<RESULT_TYPE>(args.data[1])[0];
	UnaryExecutor::Execute<INPUT_TYPE, RESULT_TYPE>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) {
		    return TemplatedIntegralDecompress<INPUT_TYPE, RESULT_TYPE>::Operation(input, min_val);
	    },
	    FunctionErrors::CANNOT_ERROR);
}